

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

ScatterOut * __thiscall
cert::Dielectric::scatter
          (ScatterOut *__return_storage_ptr__,Dielectric *this,Vec3 point,Vec3 normal,UV uv,
          Ray *r_in,PRNG *random)

{
  Vec3 *v;
  undefined1 *direction;
  undefined1 *origin;
  float ni_over_nt;
  float fVar1;
  RefractDataOut refracted;
  float local_80;
  Vec3 local_78;
  Vec3 local_68;
  Vec3 local_58;
  Vec3 local_48;
  RefractDataOut local_38;
  
  local_48.z = normal.z;
  local_48._0_8_ = normal._0_8_;
  local_58.z = point.z;
  local_58._0_8_ = point._0_8_;
  v = &r_in->direction;
  local_68 = reflect(v,&local_48);
  fVar1 = (r_in->direction).z * local_48.z +
          (r_in->direction).x * local_48.x + local_48.y * (r_in->direction).y;
  if (fVar1 <= 0.0) {
    local_80 = 0.0;
    local_78.z = local_48.z;
    local_78.x = local_48.x;
    local_78.y = local_48.y;
    ni_over_nt = 1.0 / *(float *)&(this->super_Material).field_0x14;
  }
  else {
    local_78._0_8_ = local_48._0_8_ ^ 0x8000000080000000;
    local_78.z = -local_48.z;
    ni_over_nt = *(float *)&(this->super_Material).field_0x14;
    local_80 = Vec3::length(v);
    local_80 = (fVar1 * ni_over_nt) / local_80;
  }
  local_38 = refract_func(v,&local_78,ni_over_nt);
  if (((undefined1  [16])local_38 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __return_storage_ptr__->is_scattered = true;
    (__return_storage_ptr__->attenuation).x = 1.0;
    (__return_storage_ptr__->attenuation).y = 1.0;
    (__return_storage_ptr__->attenuation).z = 1.0;
    Ray::Ray(&__return_storage_ptr__->scattered,&local_58,&local_68);
    __return_storage_ptr__->index = 0.0;
    origin = VEC3_ZERO;
    direction = VEC3_RIGHT;
  }
  else {
    fVar1 = schlick(local_80,*(float *)&(this->super_Material).field_0x14);
    __return_storage_ptr__->is_scattered = true;
    (__return_storage_ptr__->attenuation).x = 1.0;
    (__return_storage_ptr__->attenuation).y = 1.0;
    (__return_storage_ptr__->attenuation).z = 1.0;
    origin = (undefined1 *)&local_58;
    Ray::Ray(&__return_storage_ptr__->scattered,(Vec3 *)origin,&local_68);
    __return_storage_ptr__->index = fVar1;
    direction = (undefined1 *)&local_38.refracted;
  }
  Ray::Ray(&__return_storage_ptr__->refracted,(Vec3 *)origin,(Vec3 *)direction);
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 outward_normal;
		Vec3 reflected = reflect (r_in.direction, normal);
		float ni_over_nt = 0;
		float reflect_prob = 0;
		float cosine = 0;

		if (dot (r_in.direction, normal) > 0)
		{
			outward_normal = -normal;
			ni_over_nt = ref_idx;
			cosine = ref_idx * dot (r_in.direction, normal) / r_in.direction.length ();
		}
		else
		{
			outward_normal = normal;
			ni_over_nt = 1.0 / ref_idx;
		}
		RefractDataOut refracted = refract_func (r_in.direction, outward_normal, ni_over_nt);
		if (refracted.is_refracted)
		{
			reflect_prob = schlick (cosine, ref_idx);
			return { true,
				Vec3 (1.0, 1.0, 1.0),
				Ray (point, reflected),
				reflect_prob,
				Ray (point, refracted.refracted) };
		}
		else
		{
			return { true, Vec3 (1.0, 1.0, 1.0), Ray (point, reflected), 0.0 };
		}
	}